

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::BasicSharedStruct::RunIteration
          (BasicSharedStruct *this,bool dispatch_indirect)

{
  GLuint *buffers;
  CallLogWrapper *pCVar1;
  Vector<float,_4> *v;
  GLuint GVar2;
  bool bVar3;
  GLuint i;
  ulong uVar4;
  GLuint groups [3];
  Vector<float,_4> local_70;
  Vector<float,_4> local_60;
  CallLogWrapper *local_50;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,0x100,(allocator_type *)groups);
  buffers = &this->m_storage_buffer;
  GVar2 = this->m_storage_buffer;
  if (GVar2 == 0) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,buffers);
    GVar2 = *buffers;
  }
  pCVar1 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBufferBase(pCVar1,0x90d2,0,GVar2);
  glu::CallLogWrapper::glBufferData
            (pCVar1,0x90d2,0x1000,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x90d2,0);
  glu::CallLogWrapper::glUseProgram(pCVar1,this->m_program);
  if (dispatch_indirect) {
    groups._0_8_ = &DAT_100000001;
    groups[2] = 1;
    GVar2 = this->m_dispatch_buffer;
    if (GVar2 == 0) {
      glu::CallLogWrapper::glGenBuffers(pCVar1,1,&this->m_dispatch_buffer);
      GVar2 = this->m_dispatch_buffer;
    }
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x90ee,GVar2);
    glu::CallLogWrapper::glBufferData(pCVar1,0x90ee,0xc,groups,0x88e4);
    glu::CallLogWrapper::glDispatchComputeIndirect(pCVar1,0);
  }
  else {
    glu::CallLogWrapper::glDispatchCompute(pCVar1,1,1,1);
  }
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x90d2,*buffers);
  glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x200);
  local_50 = pCVar1;
  v = (Vector<float,_4> *)glu::CallLogWrapper::glMapBufferRange(pCVar1,0x90d2,0,0x1000,1);
  bVar3 = true;
  uVar4 = 0;
  do {
    pCVar1 = local_50;
    if (uVar4 == 0x100) {
      glu::CallLogWrapper::glUnmapBuffer(local_50,0x90d2);
      glu::CallLogWrapper::glBindBuffer(pCVar1,0x90d2,0);
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      return bVar3;
    }
    tcu::Vector<float,_4>::Vector(&local_60,v);
    tcu::Vector<float,_4>::Vector(&local_70,(float)(int)uVar4);
    if ((local_60.m_data[0] != local_70.m_data[0]) ||
       (NAN(local_60.m_data[0]) || NAN(local_70.m_data[0]))) {
LAB_00c20d69:
      bVar3 = false;
      anon_unknown_0::Output("Invalid data at index %d.\n",uVar4 & 0xffffffff);
    }
    else {
      if ((local_60.m_data[1] != local_70.m_data[1]) ||
         (NAN(local_60.m_data[1]) || NAN(local_70.m_data[1]))) goto LAB_00c20d69;
      if ((local_60.m_data[2] != local_70.m_data[2]) ||
         (NAN(local_60.m_data[2]) || NAN(local_70.m_data[2]))) goto LAB_00c20d69;
      if ((local_60.m_data[3] != local_70.m_data[3]) ||
         (NAN(local_60.m_data[3]) || NAN(local_70.m_data[3]))) goto LAB_00c20d69;
    }
    uVar4 = uVar4 + 1;
    v = v + 1;
  } while( true );
}

Assistant:

bool RunIteration(bool dispatch_indirect)
	{
		const GLuint kBufferSize = 256;

		std::vector<vec4> data(kBufferSize);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint groups[3] = { 1, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(groups), groups, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		vec4* result;
		result = static_cast<vec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * kBufferSize, GL_MAP_READ_BIT));
		bool res = true;
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (!IsEqual(result[i], vec4(static_cast<float>(i))))
			{
				Output("Invalid data at index %d.\n", i);
				res = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return res;
	}